

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-strtod.cc
# Opt level: O0

void TestRandomStrtof(void)

{
  undefined8 uVar1;
  uint32_t uVar2;
  float strtof_result_1;
  Vector<const_char> vector_1;
  int exponent_1;
  int j_1;
  int pos_1;
  int i_1;
  int length_1;
  float strtof_result;
  Vector<const_char> vector;
  int exponent;
  int j;
  int pos;
  int i;
  int length;
  char buffer [1024];
  undefined8 in_stack_fffffffffffffb58;
  char *in_stack_fffffffffffffb60;
  char *source;
  undefined8 in_stack_fffffffffffffb68;
  int line;
  char *in_stack_fffffffffffffb70;
  char *file;
  undefined1 local_480 [20];
  int local_46c;
  int local_468;
  int local_464;
  int local_460;
  int local_45c;
  char *local_458;
  int local_450;
  undefined4 uStack_44c;
  char *local_448;
  int local_440;
  undefined4 uStack_43c;
  float local_434;
  Vector<const_char> local_430;
  int local_41c;
  int local_418;
  int local_414;
  int local_410;
  int local_40c;
  char local_408 [528];
  float in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  Vector<const_char> in_stack_fffffffffffffe10;
  int in_stack_ffffffffffffffac;
  Vector<const_char> in_stack_ffffffffffffffb0;
  
  for (local_40c = 1; local_40c < 0xf; local_40c = local_40c + 1) {
    for (local_410 = 0; local_410 < 2; local_410 = local_410 + 1) {
      local_414 = 0;
      for (local_418 = 0; local_418 < local_40c; local_418 = local_418 + 1) {
        uVar2 = DeterministicRandom();
        local_408[local_414] = (char)((ulong)uVar2 % 10) + '0';
        local_414 = local_414 + 1;
      }
      uVar2 = DeterministicRandom();
      local_41c = (uVar2 % 0xb - 5) - local_40c;
      local_408[local_414] = '\0';
      double_conversion::Vector<const_char>::Vector(&local_430,local_408,local_414);
      local_448 = local_430.start_;
      local_440 = local_430.length_;
      uStack_43c = local_430._12_4_;
      local_434 = double_conversion::Strtof(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      local_458 = local_430.start_;
      local_450 = local_430.length_;
      uStack_44c = local_430._12_4_;
      CheckFloat(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08);
      CheckHelper(in_stack_fffffffffffffb70,(int)((ulong)in_stack_fffffffffffffb68 >> 0x20),
                  in_stack_fffffffffffffb60,SUB81((ulong)in_stack_fffffffffffffb58 >> 0x38,0));
    }
  }
  for (local_45c = 0xf; local_45c < 800; local_45c = local_45c + 2) {
    for (local_460 = 0; local_460 < 2; local_460 = local_460 + 1) {
      local_464 = 0;
      for (local_468 = 0; local_468 < local_45c; local_468 = local_468 + 1) {
        uVar2 = DeterministicRandom();
        local_408[local_464] = (char)((ulong)uVar2 % 10) + '0';
        local_464 = local_464 + 1;
      }
      uVar2 = DeterministicRandom();
      local_46c = (uVar2 % 0x4d - 0x26) - local_45c;
      local_408[local_464] = '\0';
      double_conversion::Vector<const_char>::Vector
                ((Vector<const_char> *)local_480,local_408,local_464);
      file = (char *)local_480._8_8_;
      line = local_480._4_4_;
      double_conversion::Strtof(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      uVar1 = local_480._0_8_;
      source = (char *)local_480._8_8_;
      CheckFloat(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08);
      CheckHelper(file,line,source,SUB81(uVar1,7));
    }
  }
  return;
}

Assistant:

TEST(RandomStrtof) {
  char buffer[kBufferSize];
  for (int length = 1; length < 15; length++) {
    for (int i = 0; i < kShortStrtofRandomCount; ++i) {
      int pos = 0;
      for (int j = 0; j < length; ++j) {
        buffer[pos++] = DeterministicRandom() % 10 + '0';
      }
      int exponent = DeterministicRandom() % (5*2 + 1) - 5 - length;
      buffer[pos] = '\0';
      Vector<const char> vector(buffer, pos);
      float strtof_result = Strtof(vector, exponent);
      CHECK(CheckFloat(vector, exponent, strtof_result));
    }
  }
  for (int length = 15; length < 800; length += 2) {
    for (int i = 0; i < kLargeStrtofRandomCount; ++i) {
      int pos = 0;
      for (int j = 0; j < length; ++j) {
        buffer[pos++] = DeterministicRandom() % 10 + '0';
      }
      int exponent = DeterministicRandom() % (38*2 + 1) - 38 - length;
      buffer[pos] = '\0';
      Vector<const char> vector(buffer, pos);
      float strtof_result = Strtof(vector, exponent);
      CHECK(CheckFloat(vector, exponent, strtof_result));
    }
  }
}